

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::stringOps::getTailString_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,char sep)

{
  stringOps *psVar1;
  stringOps *psVar2;
  stringOps *psVar3;
  stringOps *psVar4;
  
  psVar2 = (stringOps *)input._M_len;
  psVar4 = this;
  if (this == (stringOps *)0x0) {
LAB_0039fe05:
    psVar3 = (stringOps *)0xffffffffffffffff;
  }
  else {
    do {
      psVar3 = psVar4 + -1;
      if (psVar4 == (stringOps *)0x0) goto LAB_0039fe05;
      psVar1 = psVar4 + (long)(psVar2 + -1);
      psVar4 = psVar3;
    } while (*psVar1 != input._M_str._0_1_);
  }
  if (psVar3 != (stringOps *)0xffffffffffffffff) {
    psVar4 = psVar3 + 1;
    if (this <= psVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 psVar4,this);
    }
    this = this + -(long)psVar4;
    psVar2 = psVar2 + (long)psVar4;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,psVar2,this + (long)psVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getTailString(std::string_view input, char sep) noexcept
    {
        auto sepLoc = input.find_last_of(sep);
        auto ret = std::string(
            (sepLoc == std::string::npos) ? input : input.substr(sepLoc + 1));
        return ret;
    }